

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O3

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::run
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this)

{
  int iVar1;
  uint uVar2;
  FuncNode *pFVar3;
  RABlock *this_00;
  InstControlFlow IVar4;
  char cVar5;
  Error EVar6;
  RABlock *pRVar7;
  RABlock *pRVar8;
  Logger *pLVar9;
  undefined8 extraout_RAX;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  InvokeNode *initialNode;
  uint *puVar14;
  BaseRAPass *pBVar15;
  long lVar16;
  RABlock **item;
  InvokeNode *invokeNode;
  uint64_t uVar17;
  float in_XMM0_Da;
  InstControlFlow cf;
  LabelNode *labelNode;
  ZoneVector<asmjit::v1_14::RABlock_*> blocksWithUnknownJumps;
  InstControlFlow local_10ac;
  RABlock **local_10a8;
  LabelNode *local_10a0;
  long local_1098;
  ulong uStack_1090;
  long local_1080;
  RABlock *local_1078;
  undefined4 local_1070;
  undefined8 local_106c;
  undefined8 uStack_1064;
  undefined8 local_105c;
  undefined8 uStack_1054;
  undefined8 local_104c;
  undefined8 uStack_1044;
  undefined4 local_103c;
  uint *local_1038;
  uint local_1030 [3];
  byte local_1022 [4082];
  
  if (this->_logger != (Logger *)0x0) {
    Logger::logf(this->_logger,in_XMM0_Da);
  }
  EVar6 = prepare(this);
  if (EVar6 == 0) {
    if ((this->_logger != (Logger *)0x0) &&
       (_logNode(this,(BaseNode *)this->_funcNode,2,(char *)0x0), this->_logger != (Logger *)0x0)) {
      _logBlock(this,this->_curBlock,2);
    }
    item = &this->_curBlock;
    pFVar3 = this->_funcNode;
    invokeNode = *(InvokeNode **)&pFVar3->field_0x8;
    if (invokeNode != (InvokeNode *)0x0) {
      local_1078 = this->_curBlock;
      *(FuncNode **)(local_1078 + 0x10) = pFVar3;
      *(FuncNode **)(local_1078 + 0x18) = pFVar3;
      local_1070 = 0xffffffff;
      local_1038 = local_1030;
      local_106c = 0;
      uStack_1064 = 0;
      local_105c = 0;
      uStack_1054 = 0;
      local_104c = 0;
      uStack_1044 = 0;
      local_103c = 0;
      local_1098 = 0;
      uStack_1090 = 0;
      local_10a8 = item;
LAB_001499e5:
      do {
        iVar1 = *(int *)&invokeNode->field_0x14;
        if (1 < iVar1 + 1U) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                     ,0x60,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = *(InvokeNode **)&invokeNode->field_0x8;
        if ((invokeNode->field_0x11 & 0x20) == 0) {
          cVar5 = invokeNode->field_0x10;
          if (cVar5 == '\x03') {
            pRVar7 = *item;
            pRVar8 = *(RABlock **)&invokeNode->field_0x20;
            if (pRVar7 == (RABlock *)0x0) {
              *item = pRVar8;
              if (pRVar8 == (RABlock *)0x0) {
                pRVar8 = BaseRAPass::newBlock(this->_pass,(BaseNode *)invokeNode);
                this->_curBlock = pRVar8;
                if (pRVar8 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)&invokeNode->field_0x20 = pRVar8;
                uVar11 = *(uint *)(pRVar8 + 0xc);
              }
              else {
                uVar11 = *(uint *)(pRVar8 + 0xc);
                if ((uVar11 & 1) != 0) goto LAB_0014a134;
              }
              *(uint *)(pRVar8 + 0xc) = uVar11 | 4;
              this->_hasCode = false;
              (this->_blockRegStats)._packed = 0;
              EVar6 = BaseRAPass::addBlock(this->_pass,pRVar8);
              if (EVar6 != 0) {
                return EVar6;
              }
              pRVar8 = *local_10a8;
            }
            else if (pRVar8 == (RABlock *)0x0) {
              if ((pRVar7 == local_1078 | this->_hasCode) == 1) {
                if (*(InvokeNode **)(pRVar7 + 0x18) == invokeNode) goto LAB_0014a1cd;
                *(undefined8 *)(pRVar7 + 0x18) = *(undefined8 *)invokeNode;
                *(uint *)(pRVar7 + 0xc) = *(uint *)(pRVar7 + 0xc) | 0x201;
                *(uint *)(pRVar7 + 0x30) = *(uint *)(pRVar7 + 0x30) | (this->_blockRegStats)._packed
                ;
                pRVar7 = BaseRAPass::newBlock(this->_pass,(BaseNode *)invokeNode);
                if (pRVar7 == (RABlock *)0x0) {
                  return 1;
                }
                pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 4);
                EVar6 = RABlock::appendSuccessor(*local_10a8,pRVar7);
                if (EVar6 != 0) {
                  return EVar6;
                }
                EVar6 = BaseRAPass::addBlock(this->_pass,pRVar7);
                if (EVar6 != 0) {
                  return EVar6;
                }
                this->_curBlock = pRVar7;
                this->_hasCode = false;
                (this->_blockRegStats)._packed = 0;
              }
              *(RABlock **)&invokeNode->field_0x20 = pRVar7;
              pRVar8 = pRVar7;
            }
            else {
              pRVar8[0xc] = (RABlock)((byte)pRVar8[0xc] | 4);
              if (pRVar7 == pRVar8) {
                pRVar8 = pRVar7;
                if (this->_hasCode != false) break;
              }
              else {
                if (*(InvokeNode **)(pRVar7 + 0x18) == invokeNode) {
LAB_0014a1c8:
                  run();
LAB_0014a1cd:
                  run();
                  __clang_call_terminate(extraout_RAX);
                }
                *(undefined8 *)(pRVar7 + 0x18) = *(undefined8 *)invokeNode;
                *(uint *)(pRVar7 + 0xc) = *(uint *)(pRVar7 + 0xc) | 0x201;
                *(uint *)(pRVar7 + 0x30) = *(uint *)(pRVar7 + 0x30) | (this->_blockRegStats)._packed
                ;
                EVar6 = RABlock::appendSuccessor(pRVar7,pRVar8);
                if (EVar6 != 0) {
                  return EVar6;
                }
                EVar6 = BaseRAPass::addBlock(this->_pass,pRVar8);
                if (EVar6 != 0) {
                  return EVar6;
                }
                this->_curBlock = pRVar8;
                this->_hasCode = false;
                (this->_blockRegStats)._packed = 0;
              }
            }
            item = local_10a8;
            pLVar9 = this->_logger;
            if ((pRVar8 == (RABlock *)0x0) || (pRVar8 == this->_lastLoggedBlock)) {
LAB_00149ff2:
              if (pLVar9 != (Logger *)0x0) {
                _logNode(this,(BaseNode *)invokeNode,2,(char *)0x0);
              }
            }
            else if (pLVar9 != (Logger *)0x0) {
              _logBlock(this,pRVar8,2);
              pLVar9 = this->_logger;
              goto LAB_00149ff2;
            }
            if (*(uint32_t *)&invokeNode->field_0x30 == this->_exitLabelId) {
              pRVar7 = this->_curBlock;
              *(InvokeNode **)(pRVar7 + 0x18) = invokeNode;
              pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 1);
              *(uint *)(pRVar7 + 0x30) = *(uint *)(pRVar7 + 0x30) | (this->_blockRegStats)._packed;
              EVar6 = BaseRAPass::addExitBlock(this->_pass,pRVar7);
LAB_00149db0:
              if (EVar6 != 0) {
                return EVar6;
              }
              goto LAB_0014a053;
            }
          }
          else {
            if (this->_logger != (Logger *)0x0) {
              _logNode(this,(BaseNode *)invokeNode,4,(char *)0x0);
              cVar5 = invokeNode->field_0x10;
            }
            if (cVar5 == '\n') {
              if (invokeNode == (InvokeNode *)this->_funcNode->_end) {
                if ((this->_curBlock == (RABlock *)0x0) || ((this->_hasCode & 1U) == 0))
                goto LAB_0014a134;
                break;
              }
            }
            else if ((cVar5 == '\x10') && (invokeNode != (InvokeNode *)this->_funcNode)) break;
          }
        }
        else {
          if (*item == (RABlock *)0x0) {
            removeNode(this,(BaseNode *)invokeNode);
            invokeNode = initialNode;
            goto LAB_001499e5;
          }
          this->_hasCode = true;
          if (invokeNode->field_0x10 == '\x11') {
            if (iVar1 != -1) {
              lVar13 = *(long *)invokeNode;
              EVar6 = x86::RACFGBuilder::onBeforeRet((RACFGBuilder *)this,(FuncRetNode *)invokeNode)
              ;
              goto LAB_00149b22;
            }
LAB_00149b76:
            *(undefined4 *)&invokeNode->field_0x14 = 0;
          }
          else if (invokeNode->field_0x10 == '\x12') {
            if (iVar1 == -1) goto LAB_00149b76;
            lVar13 = *(long *)invokeNode;
            EVar6 = x86::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,invokeNode);
LAB_00149b22:
            if (EVar6 != 0) {
              return EVar6;
            }
            if (lVar13 != *(long *)invokeNode) {
              if (*(InvokeNode **)(*item + 0x10) == invokeNode) {
                *(undefined8 *)(*item + 0x10) = *(undefined8 *)(lVar13 + 8);
              }
              *(undefined4 *)&invokeNode->field_0x14 = 0xffffffff;
              invokeNode = *(InvokeNode **)(lVar13 + 8);
              if ((invokeNode->field_0x11 & 0x20) == 0) {
                run();
                goto LAB_0014a1c8;
              }
            }
            initialNode = *(InvokeNode **)&invokeNode->field_0x8;
          }
          if (this->_logger != (Logger *)0x0) {
            _logNode(this,(BaseNode *)invokeNode,4,(char *)0x0);
          }
          local_10ac = kRegular;
          local_1070 = *(undefined4 *)(this->_curBlock + 8);
          local_103c = 0;
          local_104c = 0;
          uStack_1044 = 0;
          local_105c = 0;
          uStack_1054 = 0;
          local_106c = 0;
          uStack_1064 = 0;
          local_1038 = local_1030;
          EVar6 = x86::RACFGBuilder::onInst
                            ((RACFGBuilder *)this,(InstNode *)invokeNode,&local_10ac,
                             (RAInstBuilder *)&local_1070);
          if (EVar6 != 0) {
            return EVar6;
          }
          cVar5 = invokeNode->field_0x10;
          if (cVar5 == '\x12') {
            EVar6 = x86::RACFGBuilder::onInvoke
                              ((RACFGBuilder *)this,invokeNode,(RAInstBuilder *)&local_1070);
            if (EVar6 != 0) {
              return EVar6;
            }
            cVar5 = invokeNode->field_0x10;
          }
          if (cVar5 == '\x11') {
            EVar6 = x86::RACFGBuilder::onRet
                              ((RACFGBuilder *)this,(FuncRetNode *)invokeNode,
                               (RAInstBuilder *)&local_1070);
            if (EVar6 != 0) {
              return EVar6;
            }
            local_10ac = kMaxValue;
          }
          else if ((local_10ac == kJump) && (local_1030 != local_1038)) {
            pBVar15 = this->_pass;
            uVar11 = 0;
            puVar14 = local_1030;
            do {
              if (*(uint *)&pBVar15->field_0x148 <= *puVar14) {
                run();
                goto LAB_0014a192;
              }
              if ((*(byte *)(*(long *)(*(long *)&pBVar15->_workRegs + (ulong)*puVar14 * 8) + 0x21) &
                  0xf) == 0) {
                bVar10 = *(byte *)((long)puVar14 + 0xe);
                if (bVar10 == 0xff) {
                  if (1 < uVar11) {
                    run();
                    return 1;
                  }
                  uVar12 = (ulong)uVar11;
                  uVar11 = uVar11 + 1;
                  bVar10 = (pBVar15->_scratchRegIndexes)._data[uVar12];
                  *(byte *)((long)puVar14 + 0xe) = bVar10;
                }
                *(uint *)(*item + 0xc0) = *(uint *)(*item + 0xc0) | 1 << (bVar10 & 0x1f);
              }
              puVar14 = puVar14 + 8;
            } while (puVar14 != local_1038);
          }
          EVar6 = BaseRAPass::assignRAInst
                            (this->_pass,(BaseNode *)invokeNode,this->_curBlock,
                             (RAInstBuilder *)&local_1070);
          IVar4 = local_10ac;
          if (EVar6 != 0) {
            return EVar6;
          }
          uVar11 = (this->_blockRegStats)._packed | (uint)local_105c;
          (this->_blockRegStats)._packed = uVar11;
          if (local_10ac == kRegular) goto LAB_0014a05a;
          if (kBranch < local_10ac) {
            if (local_10ac != kMaxValue) goto LAB_0014a05a;
            pRVar7 = this->_curBlock;
            *(InvokeNode **)(pRVar7 + 0x18) = invokeNode;
            pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 1);
            *(uint *)(pRVar7 + 0x30) = *(uint *)(pRVar7 + 0x30) | uVar11;
            EVar6 = RABlock::appendSuccessor(pRVar7,this->_retBlock);
            goto LAB_00149db0;
          }
          pRVar7 = *item;
          *(InvokeNode **)(pRVar7 + 0x18) = invokeNode;
          uVar2 = *(uint *)(pRVar7 + 0xc);
          *(uint *)(pRVar7 + 0xc) = uVar2 | 0x101;
          *(uint *)(pRVar7 + 0x30) = *(uint *)(pRVar7 + 0x30) | uVar11;
          if ((invokeNode->field_0x34 & 2) == 0) {
            if (invokeNode->field_0x12 == 0) break;
            lVar13 = (ulong)((byte)invokeNode->field_0x12 - 1) * 0x10;
            if ((*(uint *)(&invokeNode->field_0x40 + lVar13) & 7) == 5) {
              EVar6 = BaseBuilder::labelNodeOf
                                (&this->_cc->super_BaseBuilder,&local_10a0,
                                 *(uint32_t *)(&invokeNode->field_0x44 + lVar13));
              if (EVar6 != 0) {
                return EVar6;
              }
              pRVar7 = BaseRAPass::newBlockOrExistingAt(this->_pass,local_10a0,(BaseNode **)0x0);
              if (pRVar7 == (RABlock *)0x0) {
                return 1;
              }
              pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 4);
              EVar6 = RABlock::appendSuccessor(*item,pRVar7);
            }
            else {
              *(uint *)(pRVar7 + 0xc) = uVar2 | 0x501;
              if ((invokeNode->field_0x10 == '\x0f') &&
                 (lVar13 = *(long *)&invokeNode->_funcDetail, lVar13 != 0)) {
                uVar17 = this->_pass->_lastTimestamp + 1;
                this->_pass->_lastTimestamp = uVar17;
                uVar11 = *(uint *)(lVar13 + 0x18);
                if ((ulong)uVar11 != 0) {
                  local_1080 = *(long *)(lVar13 + 0x10);
                  lVar13 = 0;
                  do {
                    EVar6 = BaseBuilder::labelNodeOf
                                      (&this->_cc->super_BaseBuilder,&local_10a0,
                                       *(uint32_t *)(local_1080 + lVar13));
                    if (EVar6 != 0) {
                      return EVar6;
                    }
                    pRVar7 = BaseRAPass::newBlockOrExistingAt
                                       (this->_pass,local_10a0,(BaseNode **)0x0);
                    if (pRVar7 == (RABlock *)0x0) {
                      return 1;
                    }
                    if (*(uint64_t *)(pRVar7 + 0x48) != uVar17) {
                      *(uint64_t *)(pRVar7 + 0x48) = uVar17;
                      pRVar7[0xc] = (RABlock)((byte)pRVar7[0xc] | 4);
                      EVar6 = RABlock::appendSuccessor(*local_10a8,pRVar7);
                      if (EVar6 != 0) {
                        return EVar6;
                      }
                    }
                    lVar13 = lVar13 + 4;
                  } while ((ulong)uVar11 << 2 != lVar13);
                  pRVar7 = *local_10a8;
                  item = local_10a8;
                }
                EVar6 = shareAssignmentAcrossSuccessors(this,pRVar7);
              }
              else {
                EVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::append
                                  ((ZoneVector<asmjit::v1_14::RABlock_*> *)&local_1098,
                                   &this->_pass->_allocator,item);
              }
            }
            if (EVar6 != 0) {
              return EVar6;
            }
          }
          if (IVar4 != kJump) {
            if (initialNode == (InvokeNode *)0x0) break;
            if (initialNode->field_0x10 == '\x03') {
              pRVar7 = *(RABlock **)&initialNode->field_0x20;
              if (pRVar7 == (RABlock *)0x0) {
                pRVar7 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
                if (pRVar7 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)&initialNode->field_0x20 = pRVar7;
              }
            }
            else {
              pRVar7 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
              if (pRVar7 == (RABlock *)0x0) {
                return 1;
              }
            }
            this_00 = *item;
            pRVar8 = this_00 + 0xc;
            *(uint *)pRVar8 = *(uint *)pRVar8 | 0x200;
            EVar6 = RABlock::prependSuccessor(this_00,pRVar7);
            if (EVar6 != 0) {
              return EVar6;
            }
            this->_curBlock = pRVar7;
            this->_hasCode = false;
            (this->_blockRegStats)._packed = 0;
            if (((byte)pRVar7[0xc] & 1) != 0) {
LAB_0014a134:
              lVar13 = local_1098;
              pBVar15 = this->_pass;
              if (pBVar15->_createdBlockCount == *(uint32_t *)&pBVar15->field_0xb8) {
                uVar12 = uStack_1090 & 0xffffffff;
                if (uVar12 != 0) {
                  lVar16 = 0;
                  do {
                    handleBlockWithUnknownJump(this,*(RABlock **)(lVar13 + lVar16));
                    lVar16 = lVar16 + 8;
                  } while (uVar12 << 3 != lVar16);
                  pBVar15 = this->_pass;
                }
                EVar6 = BaseRAPass::initSharedAssignments(pBVar15,&this->_sharedAssignmentsMap);
                return EVar6;
              }
              return 3;
            }
            EVar6 = BaseRAPass::addBlock(this->_pass,pRVar7);
            if (EVar6 != 0) {
              return EVar6;
            }
            invokeNode = initialNode;
            if (this->_logger != (Logger *)0x0) {
              _logBlock(this,this->_curBlock,2);
            }
            goto LAB_001499e5;
          }
LAB_0014a053:
          *item = (RABlock *)0x0;
        }
LAB_0014a05a:
        invokeNode = initialNode;
      } while (initialNode != (InvokeNode *)0x0);
    }
LAB_0014a192:
    EVar6 = 3;
  }
  return EVar6;
}

Assistant:

Error run() noexcept {
    log("[BuildCFG]\n");
    ASMJIT_PROPAGATE(prepare());

    logNode(_funcNode, kRootIndentation);
    logBlock(_curBlock, kRootIndentation);

    RABlock* entryBlock = _curBlock;
    BaseNode* node = _funcNode->next();

    if (ASMJIT_UNLIKELY(!node)) {
      return DebugUtils::errored(kErrorInvalidState);
    }

    _curBlock->setFirst(_funcNode);
    _curBlock->setLast(_funcNode);

    RAInstBuilder ib;
    ZoneVector<RABlock*> blocksWithUnknownJumps;

    for (;;) {
      BaseNode* next = node->next();
      ASMJIT_ASSERT(node->position() == 0 || node->position() == kNodePositionDidOnBefore);

      if (node->isInst()) {
        // Instruction | Jump | Invoke | Return
        // ------------------------------------

        // Handle `InstNode`, `InvokeNode`, and `FuncRetNode`. All of them share the same interface that provides
        // operands that have read/write semantics.
        if (ASMJIT_UNLIKELY(!_curBlock)) {
          // Unreachable code has to be removed, we cannot allocate registers in such code as we cannot do proper
          // liveness analysis in such case.
          removeNode(node);
          node = next;
          continue;
        }

        _hasCode = true;

        if (node->isInvoke() || node->isFuncRet()) {
          if (node->position() != kNodePositionDidOnBefore) {
            // Call and Reg are complicated as they may insert some surrounding code around them. The simplest
            // approach is to get the previous node, call the `onBefore()` handlers and then check whether
            // anything changed and restart if so. By restart we mean that the current `node` would go back to
            // the first possible inserted node by `onBeforeInvoke()` or `onBeforeRet()`.
            BaseNode* prev = node->prev();

            if (node->type() == NodeType::kInvoke) {
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeInvoke(node->as<InvokeNode>()));
            }
            else {
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeRet(node->as<FuncRetNode>()));
            }

            if (prev != node->prev()) {
              // If this was the first node in the block and something was
              // inserted before it then we have to update the first block.
              if (_curBlock->first() == node) {
                _curBlock->setFirst(prev->next());
              }

              node->setPosition(kNodePositionDidOnBefore);
              node = prev->next();

              // `onBeforeInvoke()` and `onBeforeRet()` can only insert instructions.
              ASMJIT_ASSERT(node->isInst());
            }

            // Necessary if something was inserted after `node`, but nothing before.
            next = node->next();
          }
          else {
            // Change the position back to its original value.
            node->setPosition(0);
          }
        }

        InstNode* inst = node->as<InstNode>();
        logNode(inst, kCodeIndentation);

        InstControlFlow cf = InstControlFlow::kRegular;
        ib.reset(_curBlock->blockId());
        ASMJIT_PROPAGATE(static_cast<This*>(this)->onInst(inst, cf, ib));

        if (node->isInvoke()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onInvoke(inst->as<InvokeNode>(), ib));
        }

        if (node->isFuncRet()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onRet(inst->as<FuncRetNode>(), ib));
          cf = InstControlFlow::kReturn;
        }

        if (cf == InstControlFlow::kJump) {
          uint32_t fixedRegCount = 0;
          for (RATiedReg& tiedReg : ib) {
            RAWorkReg* workReg = _pass->workRegById(tiedReg.workId());
            if (workReg->group() == RegGroup::kGp) {
              uint32_t useId = tiedReg.useId();
              if (useId == BaseReg::kIdBad) {
                useId = _pass->_scratchRegIndexes[fixedRegCount++];
                tiedReg.setUseId(useId);
              }
              _curBlock->addExitScratchGpRegs(Support::bitMask(useId));
            }
          }
        }

        ASMJIT_PROPAGATE(_pass->assignRAInst(inst, _curBlock, ib));
        _blockRegStats.combineWith(ib._stats);

        if (cf != InstControlFlow::kRegular) {
          // Support for conditional and unconditional jumps.
          if (cf == InstControlFlow::kJump || cf == InstControlFlow::kBranch) {
            _curBlock->setLast(node);
            _curBlock->addFlags(RABlockFlags::kHasTerminator);
            _curBlock->makeConstructed(_blockRegStats);

            if (!inst->hasOption(InstOptions::kUnfollow)) {
              // Jmp/Jcc/Call/Loop/etc...
              uint32_t opCount = inst->opCount();
              const Operand* opArray = inst->operands();

              // Cannot jump anywhere without operands.
              if (ASMJIT_UNLIKELY(!opCount)) {
                return DebugUtils::errored(kErrorInvalidState);
              }

              if (opArray[opCount - 1].isLabel()) {
                // Labels are easy for constructing the control flow.
                LabelNode* labelNode;
                ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, opArray[opCount - 1].as<Label>()));

                RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                if (ASMJIT_UNLIKELY(!targetBlock)) {
                  return DebugUtils::errored(kErrorOutOfMemory);
                }

                targetBlock->makeTargetable();
                ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
              }
              else {
                // Not a label - could be jump with reg/mem operand, which means that it can go anywhere. Such jumps
                // must either be annotated so the CFG can be properly constructed, otherwise we assume the worst case
                // - can jump to any basic block.
                JumpAnnotation* jumpAnnotation = nullptr;
                _curBlock->addFlags(RABlockFlags::kHasJumpTable);

                if (inst->type() == NodeType::kJump) {
                  jumpAnnotation = inst->as<JumpNode>()->annotation();
                }

                if (jumpAnnotation) {
                  uint64_t timestamp = _pass->nextTimestamp();
                  for (uint32_t id : jumpAnnotation->labelIds()) {
                    LabelNode* labelNode;
                    ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, id));

                    RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                    if (ASMJIT_UNLIKELY(!targetBlock)) {
                      return DebugUtils::errored(kErrorOutOfMemory);
                    }

                    // Prevents adding basic-block successors multiple times.
                    if (!targetBlock->hasTimestamp(timestamp)) {
                      targetBlock->setTimestamp(timestamp);
                      targetBlock->makeTargetable();
                      ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
                    }
                  }
                  ASMJIT_PROPAGATE(shareAssignmentAcrossSuccessors(_curBlock));
                }
                else {
                  ASMJIT_PROPAGATE(blocksWithUnknownJumps.append(_pass->allocator(), _curBlock));
                }
              }
            }

            if (cf == InstControlFlow::kJump) {
              // Unconditional jump makes the code after the jump unreachable, which will be removed instantly during
              // the CFG construction; as we cannot allocate registers for instructions that are not part of any block.
              // Of course we can leave these instructions as they are, however, that would only postpone the problem
              // as assemblers can't encode instructions that use virtual registers.
              _curBlock = nullptr;
            }
            else {
              node = next;
              if (ASMJIT_UNLIKELY(!node))
                return DebugUtils::errored(kErrorInvalidState);

              RABlock* consecutiveBlock;
              if (node->type() == NodeType::kLabel) {
                if (node->hasPassData()) {
                  consecutiveBlock = node->passData<RABlock>();
                }
                else {
                  consecutiveBlock = _pass->newBlock(node);
                  if (ASMJIT_UNLIKELY(!consecutiveBlock)) {
                    return DebugUtils::errored(kErrorOutOfMemory);
                  }
                  node->setPassData<RABlock>(consecutiveBlock);
                }
              }
              else {
                consecutiveBlock = _pass->newBlock(node);
                if (ASMJIT_UNLIKELY(!consecutiveBlock)) {
                  return DebugUtils::errored(kErrorOutOfMemory);
                }
              }

              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              ASMJIT_PROPAGATE(_curBlock->prependSuccessor(consecutiveBlock));

              _curBlock = consecutiveBlock;
              _hasCode = false;
              _blockRegStats.reset();

              if (_curBlock->isConstructed())
                break;
              ASMJIT_PROPAGATE(_pass->addBlock(consecutiveBlock));

              logBlock(_curBlock, kRootIndentation);
              continue;
            }
          }

          if (cf == InstControlFlow::kReturn) {
            _curBlock->setLast(node);
            _curBlock->makeConstructed(_blockRegStats);
            ASMJIT_PROPAGATE(_curBlock->appendSuccessor(_retBlock));

            _curBlock = nullptr;
          }
        }
      }
      else if (node->type() == NodeType::kLabel) {
        // Label - Basic-Block Management
        // ------------------------------

        if (!_curBlock) {
          // If the current code is unreachable the label makes it reachable again. We may remove the whole block in
          // the future if it's not referenced though.
          _curBlock = node->passData<RABlock>();

          if (_curBlock) {
            // If the label has a block assigned we can either continue with it or skip it if the block has been
            // constructed already.
            if (_curBlock->isConstructed()) {
              break;
            }
          }
          else {
            // No block assigned - create a new one and assign it.
            _curBlock = _pass->newBlock(node);
            if (ASMJIT_UNLIKELY(!_curBlock)) {
              return DebugUtils::errored(kErrorOutOfMemory);
            }
            node->setPassData<RABlock>(_curBlock);
          }

          _curBlock->makeTargetable();
          _hasCode = false;
          _blockRegStats.reset();
          ASMJIT_PROPAGATE(_pass->addBlock(_curBlock));
        }
        else {
          if (node->hasPassData()) {
            RABlock* consecutive = node->passData<RABlock>();
            consecutive->makeTargetable();

            if (_curBlock == consecutive) {
              // The label currently processed is part of the current block. This is only possible for multiple labels
              // that are right next to each other or labels that are separated by non-code nodes like directives and
              // comments.
              if (ASMJIT_UNLIKELY(_hasCode)) {
                return DebugUtils::errored(kErrorInvalidState);
              }
            }
            else {
              // Label makes the current block constructed. There is a chance that the Label is not used, but we don't
              // know that at this point. In the worst case there would be two blocks next to each other, it's just fine.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }
          }
          else {
            // First time we see this label.
            if (_hasCode || _curBlock == entryBlock) {
              // Cannot continue the current block if it already contains some code or it's a block entry. We need to
              // create a new block and make it a successor.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlockFlags::kHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              RABlock* consecutive = _pass->newBlock(node);
              if (ASMJIT_UNLIKELY(!consecutive)) {
                return DebugUtils::errored(kErrorOutOfMemory);
              }
              consecutive->makeTargetable();

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }

            node->setPassData<RABlock>(_curBlock);
          }
        }

        if (_curBlock && _curBlock != _lastLoggedBlock) {
          logBlock(_curBlock, kRootIndentation);
        }
        logNode(node, kRootIndentation);

        // Unlikely: Assume that the exit label is reached only once per function.
        if (ASMJIT_UNLIKELY(node->as<LabelNode>()->labelId() == _exitLabelId)) {
          _curBlock->setLast(node);
          _curBlock->makeConstructed(_blockRegStats);
          ASMJIT_PROPAGATE(_pass->addExitBlock(_curBlock));

          _curBlock = nullptr;
        }
      }
      else {
        // Other Nodes | Function Exit
        // ---------------------------

        logNode(node, kCodeIndentation);

        if (node->type() == NodeType::kSentinel) {
          if (node == _funcNode->endNode()) {
            // Make sure we didn't flow here if this is the end of the function sentinel.
            if (ASMJIT_UNLIKELY(_curBlock && _hasCode))
              return DebugUtils::errored(kErrorInvalidState);
            break;
          }
        }
        else if (node->type() == NodeType::kFunc) {
          // RAPass can only compile a single function at a time. If we
          // encountered a function it must be the current one, bail if not.
          if (ASMJIT_UNLIKELY(node != _funcNode))
            return DebugUtils::errored(kErrorInvalidState);
          // PASS if this is the first node.
        }
        else {
          // PASS if this is a non-interesting or unknown node.
        }
      }

      // Advance to the next node.
      node = next;

      // NOTE: We cannot encounter a NULL node, because every function must be terminated by a sentinel (`stop`)
      // node. If we encountered a NULL node it means that something went wrong and this node list is corrupted;
      // bail in such case.
      if (ASMJIT_UNLIKELY(!node))
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (_pass->hasDanglingBlocks())
      return DebugUtils::errored(kErrorInvalidState);

    for (RABlock* block : blocksWithUnknownJumps)
      handleBlockWithUnknownJump(block);

    return _pass->initSharedAssignments(_sharedAssignmentsMap);
  }